

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

int gmath::anon_unknown_0::computeRadialDistortion
              (int n,double *x,int m,double *fvec,double *fjac,void *up)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (fvec != (double *)0x0) {
    dVar3 = *x;
    dVar2 = dVar3 * dVar3 + x[1] * x[1];
    dVar2 = *(double *)((long)up + 0x10) * dVar2 * dVar2 * dVar2 +
            *(double *)((long)up + 8) * dVar2 * dVar2 + *up * dVar2 + 1.0;
    *fvec = *(double *)((long)up + 0x18) - dVar3 * dVar2;
    fvec[1] = *(double *)((long)up + 0x20) - dVar2 * x[1];
  }
  if (fjac != (double *)0x0) {
    dVar3 = *x;
    dVar4 = dVar3 * dVar3 + x[1] * x[1];
    dVar2 = *(double *)((long)up + 8);
    dVar1 = dVar4 * *(double *)((long)up + 0x10) * dVar4 * dVar4 +
            dVar2 * dVar4 * dVar4 + *up * dVar4 + 1.0;
    dVar2 = *(double *)((long)up + 0x10) * 3.0 * dVar4 * dVar4 + (dVar2 + dVar2) * dVar4 + *up;
    *fjac = -((dVar3 + dVar3) * dVar3 * dVar2 + dVar1);
    dVar3 = *x * -2.0 * x[1] * dVar2;
    fjac[1] = dVar3;
    fjac[2] = dVar3;
    dVar3 = x[1];
    fjac[3] = -((dVar3 + dVar3) * dVar3 * dVar2 + dVar1);
  }
  return 0;
}

Assistant:

int computeRadialDistortion(int n, double x[], int m, double fvec[],
                            double fjac[], void *up)
{
  RadialDistortionParameter *p=static_cast<RadialDistortionParameter *>(up);

  if (fvec != 0)
  {
    const double r2=x[0]*x[0]+x[1]*x[1];
    const double s=1.0+p->kd[0]*r2+p->kd[1]*r2*r2+p->kd[2]*r2*r2*r2;

    fvec[0]=p->xd-x[0]*s;
    fvec[1]=p->yd-x[1]*s;
  }

  if (fjac != 0)
  {
    const double r2=x[0]*x[0]+x[1]*x[1];

    const double f=1.0+p->kd[0]*r2+p->kd[1]*r2*r2+p->kd[2]*r2*r2*r2;
    const double fs=p->kd[0]+2*p->kd[1]*r2+3*p->kd[2]*r2*r2;

    fjac[0]=-(f+2*x[0]*x[0]*fs);
    fjac[1]=-(2*x[0]*x[1]*fs);
    fjac[2]=fjac[1];
    fjac[3]=-(f+2*x[1]*x[1]*fs);
  }

  return 0;
}